

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  string out;
  Rune r;
  StringPiece vec [17];
  char *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  StringPiece local_168;
  StringPiece *local_158;
  RE2 *local_150;
  StringPiece local_148 [17];
  
  iVar2 = 0;
  memset(local_148,0,0x110);
  uVar9 = 0;
  if (0 < (long)rewrite->size_) {
    pcVar5 = rewrite->data_;
    pcVar4 = pcVar5 + rewrite->size_;
    uVar9 = 0;
    do {
      if (*pcVar5 == '\\') {
        pcVar5 = pcVar5 + 1;
        uVar6 = 0xffffffcf;
        if (pcVar5 < pcVar4) {
          uVar6 = (int)*pcVar5 - 0x30;
        }
        uVar7 = uVar9;
        if ((int)uVar9 < (int)uVar6) {
          uVar7 = uVar6;
        }
        if (uVar6 < 10) {
          uVar9 = uVar7;
        }
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 < pcVar4);
  }
  if ((uVar9 < 0x11) && ((int)uVar9 <= re->num_captures_)) {
    pcVar4 = (str->_M_dataplus)._M_p;
    pcVar5 = pcVar4 + str->_M_string_length;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    local_158 = rewrite;
    if ((long)str->_M_string_length < 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      local_198 = (char *)0x0;
      local_150 = re;
      do {
        while( true ) {
          if (maximum_global_replace_count <= iVar3 && maximum_global_replace_count != -1)
          goto LAB_00222ce4;
          local_168.data_ = (str->_M_dataplus)._M_p;
          local_168.size_ = str->_M_string_length;
          bVar1 = Match(re,&local_168,(long)pcVar4 - (long)local_168.data_,local_168.size_,
                        UNANCHORED,local_148,uVar9 + 1);
          if (!bVar1) goto LAB_00222ce4;
          if (pcVar4 < local_148[0].data_) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_188,pcVar4,(long)local_148[0].data_ - (long)pcVar4);
          }
          if ((local_148[0].data_ != local_198) || (local_148[0].size_ != 0)) break;
          if ((re->options_).encoding_ == EncodingUTF8) {
            lVar8 = (long)pcVar5 - (long)pcVar4;
            if (3 < lVar8) {
              lVar8 = 4;
            }
            iVar2 = fullrune(pcVar4,(int)lVar8);
            if (iVar2 == 0) goto LAB_00222c6e;
            iVar2 = chartorune((Rune *)&local_168,pcVar4);
            if (0x10ffff < (int)local_168.data_) {
              local_168.data_ = (const_pointer)CONCAT44(local_168.data_._4_4_,0xfffd);
              iVar2 = 1;
            }
            re = local_150;
            if ((int)local_168.data_ == 0xfffd && iVar2 == 1) goto LAB_00222c6e;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_188,pcVar4,(long)iVar2);
            pcVar4 = pcVar4 + iVar2;
            re = local_150;
          }
          else {
LAB_00222c6e:
            if (pcVar4 < pcVar5) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_188,pcVar4,1);
            }
            pcVar4 = pcVar4 + 1;
          }
          if (pcVar5 < pcVar4) goto LAB_00222ce4;
        }
        Rewrite(re,&local_188,local_158,local_148,uVar9 + 1);
        pcVar4 = local_148[0].data_ + local_148[0].size_;
        iVar3 = iVar3 + 1;
        local_198 = pcVar4;
      } while (pcVar4 <= pcVar5);
    }
LAB_00222ce4:
    local_198 = pcVar4;
    iVar2 = 0;
    if (iVar3 != 0) {
      if (local_198 < pcVar5) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_188,local_198,(long)pcVar5 - (long)local_198);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                (&local_188,str);
      iVar2 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
  }
  return iVar2;
}

Assistant:

int RE2::GlobalReplace(std::string* str,
                       const RE2& re,
                       const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  std::string out;
  int count = 0;
  while (p <= ep) {
    if (maximum_global_replace_count != -1 &&
        count >= maximum_global_replace_count)
      break;
    if (!re.Match(*str, static_cast<size_t>(p - str->data()),
                  str->size(), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].data())
      out.append(p, vec[0].data() - p);
    if (vec[0].data() == lastend && vec[0].empty()) {
      // Disallow empty match at end of last match: skip ahead.
      //
      // fullrune() takes int, not ptrdiff_t. However, it just looks
      // at the leading byte and treats any length >= 4 the same.
      if (re.options().encoding() == RE2::Options::EncodingUTF8 &&
          fullrune(p, static_cast<int>(std::min(ptrdiff_t{4}, ep - p)))) {
        // re is in UTF-8 mode and there is enough left of str
        // to allow us to advance by up to UTFmax bytes.
        Rune r;
        int n = chartorune(&r, p);
        // Some copies of chartorune have a bug that accepts
        // encodings of values in (10FFFF, 1FFFFF] as valid.
        if (r > Runemax) {
          n = 1;
          r = Runeerror;
        }
        if (!(n == 1 && r == Runeerror)) {  // no decoding error
          out.append(p, n);
          p += n;
          continue;
        }
      }
      // Most likely, re is in Latin-1 mode. If it is in UTF-8 mode,
      // we fell through from above and the GIGO principle applies.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].data() + vec[0].size();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  using std::swap;
  swap(out, *str);
  return count;
}